

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,_2,_0>::accumulateDerivativesDispatch1<false>
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  double *in_RCX;
  double *in_RDX;
  BeagleCPU4StateSSEImpl<double,_2,_0> *in_RSI;
  double *in_RDI;
  
  if (in_RDX == (double *)0x0) {
    BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesDispatch2<false,false>
              (in_RSI,(double *)0x0,in_RCX,in_RDI);
  }
  else {
    BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesDispatch2<false,true>
              (in_RSI,in_RDX,in_RCX,in_RDI);
  }
  return;
}

Assistant:

BEAGLE_CPU_4_SSE_TEMPLATE template <bool DoDerivatives>
void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesDispatch1(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumDerivatives == NULL) {
        accumulateDerivativesDispatch2<DoDerivatives, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch2<DoDerivatives, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}